

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O3

bool am_install_match_command(Am_Object *match_command,Am_Object *script_execute_command)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  Am_Object installed_on_command;
  Am_Object orig_command;
  Am_Object widget;
  Am_Object command;
  char line [250];
  ostrstream oss;
  Am_Object local_2c0;
  Am_Object local_2b8;
  Am_Object local_2b0;
  Am_Object local_2a8;
  Am_Object local_2a0;
  Am_Object_Method local_298 [16];
  Am_Object_Method local_198 [23];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nInstalling match command ",0x1a);
  poVar5 = operator<<((ostream *)&std::cout,match_command);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," for ",5);
  poVar5 = operator<<(poVar5,script_execute_command);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::ostream::flush();
  pAVar6 = Am_Object::Get(match_command,0xc5,0);
  Am_Object::Am_Object(&local_2a0,pAVar6);
  local_2b8.data = (Am_Object_Data *)0x0;
  local_2c0.data = (Am_Object_Data *)0x0;
  find_widget_for(&local_2b0,&local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found widget ",0xd);
  poVar5 = operator<<((ostream *)&std::cout,&local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," for ",5);
  poVar5 = operator<<(poVar5,&local_2b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::ostream::flush();
  pAVar6 = Am_Object::Get(&local_2a0,0x175,1);
  bVar2 = Am_Value::Valid(pAVar6);
  AVar1 = Am_WIDGET_FOR_COMMAND;
  if (bVar2) {
    std::ostrstream::ostrstream((ostrstream *)local_198,(char *)local_298,0xfa,_S_out);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Sorry, invoking on ANY command not implemented",0x2e);
    std::ostream::put((char)local_198);
    Am_Pop_Up_Error_Window((char *)local_298);
    std::ostrstream::~ostrstream((ostrstream *)local_198);
  }
  else {
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_2b0);
    Am_Object::Set(match_command,AVar1,pAVar7,0);
    AVar1 = Am_SCRIPT_EXECUTE_COMMAND;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(script_execute_command);
    Am_Object::Set(match_command,AVar1,pAVar7,0);
    pAVar6 = Am_Object::Get(match_command,Am_BEFORE_OR_AFTER,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    if (iVar4 == 0x34) {
      local_198[0].from_wrapper = am_after_match_do_method.from_wrapper;
      local_198[0].Call = am_after_match_do_method.Call;
      Am_Object::operator=(&local_2c0,&local_2b8);
    }
    else {
      Am_Object::Am_Object(&local_2a8,&Am_Interactor);
      bVar3 = Am_Object::Is_Instance_Of(&local_2b0,&local_2a8);
      Am_Object::~Am_Object(&local_2a8);
      if (bVar3) {
        Am_Object::operator=(&local_2c0,&local_2b0);
      }
      else {
        find_top_of_impl_chain((Am_Object *)local_298);
        Am_Object::operator=(&local_2c0,(Am_Object *)local_298);
        Am_Object::~Am_Object((Am_Object *)local_298);
      }
      local_198[0].from_wrapper = am_before_match_do_method.from_wrapper;
      local_198[0].Call = am_before_match_do_method.Call;
    }
    pAVar6 = Am_Object::Get(&local_2c0,Am_REAL_DO_METHOD,1);
    bVar3 = Am_Value::Valid(pAVar6);
    if (!bVar3) {
      pAVar6 = Am_Object::Get(&local_2c0,0xca,0);
      Am_Object_Method::Am_Object_Method(local_298,pAVar6);
      if ((local_298[0].from_wrapper != am_after_match_do_method.from_wrapper) &&
         (local_298[0].from_wrapper != am_before_match_do_method.from_wrapper)) {
        Am_Object::Set(&local_2c0,Am_REAL_DO_METHOD,local_298[0].from_wrapper,1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Setting DO_method of ",0x15);
    poVar5 = operator<<((ostream *)&std::cout,&local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
    poVar5 = operator<<(poVar5,local_198);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ostream::flush();
    Am_Object::Set(&local_2c0,0xca,local_198[0].from_wrapper,0);
    AVar1 = Am_INVOKE_MATCH_COMMAND;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(match_command);
    Am_Object::Set(&local_2c0,AVar1,pAVar7,1);
    AVar1 = Am_ORIG_COMMAND;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_2b8);
    Am_Object::Set(match_command,AVar1,pAVar7,0);
    AVar1 = Am_INSTALLED_ON_COMMAND;
    pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_2c0);
    Am_Object::Set(match_command,AVar1,pAVar7,0);
  }
  Am_Object::~Am_Object(&local_2b0);
  Am_Object::~Am_Object(&local_2c0);
  Am_Object::~Am_Object(&local_2b8);
  Am_Object::~Am_Object(&local_2a0);
  return !bVar2;
}

Assistant:

bool
am_install_match_command(Am_Object &match_command,
                         Am_Object &script_execute_command)
{
  std::cout << "\nInstalling match command " << match_command << " for "
            << script_execute_command << std::endl
            << std::flush;
  Am_Object command = match_command.Get(Am_COMMAND);
  Am_Object orig_command, installed_on_command;
  Am_Object widget = find_widget_for(command, orig_command);
  std::cout << "Found widget " << widget << " for " << orig_command << std::endl
            << std::flush;
  if (command.Peek(Am_REGISTER_COMMAND).Valid()) {
    AM_POP_UP_ERROR_WINDOW("Sorry, invoking on ANY command not implemented");
    return false;
  }
  match_command.Set(Am_WIDGET_FOR_COMMAND, widget);
  match_command.Set(Am_SCRIPT_EXECUTE_COMMAND, script_execute_command);
  Am_Object_Method new_method;
  int before_after = match_command.Get(Am_BEFORE_OR_AFTER);
  if (before_after == am_after_command) {
    new_method = am_after_match_do_method;
    installed_on_command = orig_command;
  } else {
    if (widget.Is_Instance_Of(Am_Interactor)) {
      //interactors do the work in the do method of the interactor,
      // instead of in the do method of the command object in the
      // interactor, so have to replace the do method of the interactor itself
      installed_on_command = widget;
    } else
      installed_on_command = find_top_of_impl_chain(orig_command);
    new_method = am_before_match_do_method;
  }
  if (!installed_on_command.Peek(Am_REAL_DO_METHOD).Valid()) {
    Am_Object_Method do_method = installed_on_command.Get(Am_DO_METHOD);
    if (do_method != am_after_match_do_method &&
        do_method != am_before_match_do_method)
      installed_on_command.Set(Am_REAL_DO_METHOD, do_method,
                               Am_OK_IF_NOT_THERE);
  }
  std::cout << "Setting DO_method of " << orig_command << " to " << new_method
            << std::endl
            << std::flush;
  installed_on_command.Set(Am_DO_METHOD, new_method);
  installed_on_command.Set(Am_INVOKE_MATCH_COMMAND, match_command,
                           Am_OK_IF_NOT_THERE);
  match_command.Set(Am_ORIG_COMMAND, orig_command);
  match_command.Set(Am_INSTALLED_ON_COMMAND, installed_on_command);
  return true;
}